

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_repeat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  uint32_t len;
  gravity_fiber_t *pgVar2;
  char *s_00;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_string_t *s;
  uint32_t i;
  uint32_t seek;
  char *new_str;
  uint32_t new_size;
  char local_2048 [8];
  char _buffer_1 [4096];
  gravity_int_t times_to_repeat;
  gravity_string_t *main_str;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) && (args[1].isa == gravity_class_int)) {
    pgVar1 = (args->field_1).p;
    _buffer_1._4088_8_ = args[1].field_1.n;
    if (((long)_buffer_1._4088_8_ < 1) || (0x400000 < (long)_buffer_1._4088_8_)) {
      snprintf(local_2048,0x1000,"String.repeat() expects a value >= 1 and < %d",0x400000);
      pgVar2 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar2,local_2048);
      value_01.field_1.n = 0;
      value_01.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_01,_buffer._4088_4_);
      vm_local._7_1_ = false;
    }
    else {
      len = *(int *)((long)&pgVar1->identifier + 4) * (int)_buffer_1._4088_8_;
      s_00 = (char *)gravity_calloc(vm,1,(ulong)(len + 1));
      if (s_00 == (char *)0x0) {
        value_00.field_1.n = 0;
        value_00.isa = gravity_class_null;
        gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
        vm_local._7_1_ = false;
      }
      else {
        s._4_4_ = 0;
        for (s._0_4_ = 0; (long)(ulong)(uint)s < (long)_buffer_1._4088_8_; s._0_4_ = (uint)s + 1) {
          memcpy(s_00 + s._4_4_,pgVar1->objclass,(ulong)*(uint *)((long)&pgVar1->identifier + 4));
          s._4_4_ = *(int *)((long)&pgVar1->identifier + 4) + s._4_4_;
        }
        aVar3.p = (gravity_object_t *)gravity_string_new(vm,s_00,len,len);
        value.field_1.p = (gravity_object_t *)aVar3.n;
        value.isa = (aVar3.p)->isa;
        gravity_vm_setslot(vm,value,_buffer._4088_4_);
        vm_local._7_1_ = true;
      }
    }
  }
  else {
    snprintf(local_1028,0x1000,"String.repeat() expects an integer argument");
    pgVar2 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar2,local_1028);
    value_02.field_1.n = 0;
    value_02.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_02,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_repeat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if ((nargs != 2) || (!VALUE_ISA_INT(GET_VALUE(1)))) {
        RETURN_ERROR("String.repeat() expects an integer argument");
    }

    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));
    gravity_int_t times_to_repeat = VALUE_AS_INT(GET_VALUE(1));
    if (times_to_repeat < 1 || times_to_repeat > MAX_ALLOCATION) {
        RETURN_ERROR("String.repeat() expects a value >= 1 and < %d", MAX_ALLOCATION);
    }

    // figure out the size of the array we need to make to hold the new string
    uint32_t new_size = (uint32_t)(main_str->len * times_to_repeat);
    char *new_str = mem_alloc(vm, new_size+1);
    CHECK_MEM_ALLOC(new_str);

    uint32_t seek = 0;
    for (uint32_t i = 0; i < times_to_repeat; ++i) {
        memcpy(new_str+seek, main_str->s, main_str->len);
        seek += main_str->len;
    }

    gravity_string_t *s = gravity_string_new(vm, new_str, new_size, new_size);
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}